

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_drop.hpp
# Opt level: O0

void __thiscall
duckdb::PhysicalDrop::PhysicalDrop
          (PhysicalDrop *this,
          unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *info,
          idx_t estimated_cardinality)

{
  initializer_list<duckdb::LogicalType> iVar1;
  undefined8 *in_RDI;
  allocator_type *in_stack_ffffffffffffff38;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff50;
  LogicalTypeId in_stack_ffffffffffffff5f;
  PhysicalOperator *in_stack_ffffffffffffff60;
  undefined1 **local_90;
  undefined1 *local_58 [3];
  undefined8 *local_40;
  undefined8 local_38;
  
  LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
  local_40 = local_58;
  local_38 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x77317f);
  iVar1._M_len = (size_type)in_stack_ffffffffffffff50;
  iVar1._M_array = in_stack_ffffffffffffff48;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_ffffffffffffff40,iVar1,in_stack_ffffffffffffff38);
  PhysicalOperator::PhysicalOperator
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f,in_stack_ffffffffffffff50,
             (idx_t)in_stack_ffffffffffffff48);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x7731cf);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x7731d9);
  local_90 = (undefined1 **)&local_40;
  do {
    local_90 = local_90 + -3;
    LogicalType::~LogicalType((LogicalType *)0x7731ff);
  } while (local_90 != local_58);
  *in_RDI = &PTR__PhysicalDrop_03531a88;
  unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::unique_ptr
            ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
             in_stack_ffffffffffffff40,
             (unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
             in_stack_ffffffffffffff38);
  return;
}

Assistant:

explicit PhysicalDrop(unique_ptr<DropInfo> info, idx_t estimated_cardinality)
	    : PhysicalOperator(PhysicalOperatorType::DROP, {LogicalType::BOOLEAN}, estimated_cardinality),
	      info(std::move(info)) {
	}